

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

partSizeData *
initAndReadDeepTiled
          (vector<int,_std::allocator<int>_> *sampleCount,
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          *sampleData,
          vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
          *pixelPtrs,DeepFrameBuffer *buf,DeepTiledInputPart *in,
          vector<int,_std::allocator<int>_> *inputSampleCount,Header *outHeader,
          vector<double,_std::allocator<double>_> *countPerf,
          vector<double,_std::allocator<double>_> *samplePerf)

{
  PixelType PVar1;
  time_point end;
  time_point end_00;
  time_point start;
  time_point start_00;
  Slice *pSVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  runtime_error *prVar7;
  int *piVar8;
  DeepSlice *pDVar9;
  char **ppcVar10;
  reference piVar11;
  Channel *pCVar12;
  char *pcVar13;
  reference this;
  reference ppcVar14;
  const_reference pvVar15;
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  *in_RCX;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int iVar16;
  partSizeData *in_RDI;
  Slice *in_R8;
  DeepFrameBuffer *in_R9;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  time_point endSampleRead;
  time_point startSampleRead;
  uint64_t p;
  int offset;
  int samplesize_1;
  ConstIterator i_2;
  int i_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  size_t totalSamples;
  time_point endCountRead;
  time_point startCountRead;
  vector<int,_std::allocator<int>_> *samples;
  int samplesize;
  ConstIterator i;
  int bytesPerSample;
  int channelNumber;
  uint64_t offsetToOrigin;
  int numChans;
  uint64_t numPixels;
  uint64_t height;
  uint64_t width;
  Box2i dw;
  TileDescription tiling;
  partSizeData *data;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  size_type in_stack_fffffffffffffdb8;
  DeepFrameBuffer *in_stack_fffffffffffffdc0;
  vector<int,_std::allocator<int>_> *local_208;
  size_type local_190;
  int local_188;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_160;
  vector<int,_std::allocator<int>_> *local_158;
  long local_150;
  undefined8 local_148;
  undefined8 local_140;
  double local_138;
  undefined8 local_130;
  undefined8 local_128;
  vector<int,_std::allocator<int>_> *local_120;
  DeepSlice local_118 [60];
  int local_dc;
  undefined8 local_d8;
  undefined8 local_d0;
  int local_c8;
  int local_c4;
  Slice local_c0 [56];
  long local_88;
  int local_7c;
  uint64_t local_78;
  long local_70;
  long local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  undefined8 local_40;
  undefined8 local_38;
  DeepFrameBuffer *local_30;
  Slice *local_28;
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  *local_20;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *local_18;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Imf_3_4::DeepTiledInputPart::header();
  puVar6 = (undefined8 *)Imf_3_4::Header::tileDescription();
  local_40 = *puVar6;
  local_38 = puVar6[1];
  if ((int)local_38 == 1) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar7,"exrmetrics does not support mipmapped deep tiled parts");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((int)local_38 != 2) {
    Imf_3_4::DeepTiledInputPart::header();
    Imf_3_4::Header::dataWindow();
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
              ((Box<Imath_3_2::Vec2<int>_> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (Box<Imath_3_2::Vec2<int>_> *)
               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    local_68 = (long)((local_54 + 1) - local_5c);
    local_70 = (long)((local_50 + 1) - local_58);
    local_78 = local_68 * local_70;
    Imf_3_4::DeepTiledInputPart::header();
    local_7c = channelCount((Header *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0))
    ;
    local_88 = local_68 * local_58 + (long)local_5c;
    std::
    vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
    ::resize((vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
              *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
    pSVar2 = local_28;
    piVar8 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x1152e6);
    uVar17 = 1;
    uVar18 = 0;
    uVar19 = 0;
    Imf_3_4::Slice::Slice
              (local_c0,UINT,(char *)(piVar8 + -local_88),4,local_68 << 2,1,1,0.0,false,false);
    Imf_3_4::DeepFrameBuffer::insertSampleCountSlice(pSVar2);
    local_c4 = 0;
    local_c8 = 0;
    Imf_3_4::Header::channels();
    local_d0 = Imf_3_4::ChannelList::begin();
    while( true ) {
      Imf_3_4::Header::channels();
      local_d8 = Imf_3_4::ChannelList::end();
      bVar3 = Imf_3_4::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffffda4,uVar18),
                                  (ConstIterator *)CONCAT44(in_stack_fffffffffffffd9c,uVar17));
      if (!bVar3) break;
      std::
      vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
      ::operator[](local_20,(long)local_c4);
      std::vector<char_*,_std::allocator<char_*>_>::resize
                ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8);
      pCVar12 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x1153ef);
      local_dc = Imf_3_4::pixelTypeSize(*(PixelType *)pCVar12);
      pSVar2 = local_28;
      pDVar9 = (DeepSlice *)Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x115417);
      pCVar12 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x115429);
      PVar1 = *(PixelType *)pCVar12;
      std::
      vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
      ::operator[](local_20,(long)local_c4);
      ppcVar10 = std::vector<char_*,_std::allocator<char_*>_>::data
                           ((vector<char_*,_std::allocator<char_*>_> *)0x11544c);
      uVar17 = 1;
      uVar18 = 1;
      uVar19 = 0;
      in_stack_fffffffffffffdb0 = 0;
      Imf_3_4::DeepSlice::DeepSlice
                (local_118,PVar1,(char *)(ppcVar10 + -local_88),8,local_68 << 3,(long)local_dc,1,1,
                 0.0,false,false);
      Imf_3_4::DeepFrameBuffer::insert((char *)pSVar2,pDVar9);
      local_c4 = local_c4 + 1;
      local_c8 = local_dc + local_c8;
      Imf_3_4::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffda4,uVar18));
    }
    if (in_stack_00000008 == (vector<int,_std::allocator<int>_> *)0x0) {
      local_208 = local_10;
    }
    else {
      local_208 = in_stack_00000008;
    }
    local_120 = local_208;
    if (in_stack_00000008 == (vector<int,_std::allocator<int>_> *)0x0) {
      Imf_3_4::DeepTiledInputPart::setFrameBuffer(local_30);
      local_128 = std::chrono::_V2::steady_clock::now();
      iVar16 = (int)local_30;
      iVar4 = Imf_3_4::DeepTiledInputPart::numXTiles(iVar16);
      iVar5 = Imf_3_4::DeepTiledInputPart::numYTiles((int)local_30);
      uVar17 = 0;
      Imf_3_4::DeepTiledInputPart::readPixelSampleCounts(iVar16,0,iVar4 + -1,0,iVar5 + -1,0);
      local_148 = std::chrono::_V2::steady_clock::now();
      local_140 = local_128;
      start.__d.__r._4_4_ = in_stack_fffffffffffffdb4;
      start.__d.__r._0_4_ = in_stack_fffffffffffffdb0;
      end.__d.__r._4_4_ = in_stack_fffffffffffffdac;
      end.__d.__r._0_4_ = uVar19;
      local_130 = local_148;
      local_138 = timing(start,end);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffda4,uVar18),
                 (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffd9c,uVar17));
    }
    local_150 = 0;
    local_158 = local_120;
    local_160._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffd9c,uVar17));
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffffd9c,uVar17));
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)CONCAT44(in_stack_fffffffffffffda4,uVar18),
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd9c,uVar17)), bVar3) {
      piVar11 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_160);
      local_150 = *piVar11 + local_150;
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_160);
    }
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::resize((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_c4 = 0;
    Imf_3_4::DeepTiledInputPart::header();
    Imf_3_4::Header::channels();
    Imf_3_4::ChannelList::begin();
    while( true ) {
      Imf_3_4::DeepTiledInputPart::header();
      Imf_3_4::Header::channels();
      Imf_3_4::ChannelList::end();
      bVar3 = Imf_3_4::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffffda4,uVar18),
                                  (ConstIterator *)CONCAT44(in_stack_fffffffffffffd9c,uVar17));
      if (!bVar3) break;
      pCVar12 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x115756);
      iVar4 = Imf_3_4::pixelTypeSize(*(PixelType *)pCVar12);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::operator[](local_18,(long)local_c4);
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8);
      local_188 = 0;
      for (local_190 = 0; local_190 < local_78; local_190 = local_190 + 1) {
        std::
        vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        ::operator[](local_18,(long)local_c4);
        pcVar13 = std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)0x1157dc);
        this = std::
               vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
               ::operator[](local_20,(long)local_c4);
        ppcVar14 = std::vector<char_*,_std::allocator<char_*>_>::operator[](this,local_190);
        *ppcVar14 = pcVar13 + local_188 * iVar4;
        pvVar15 = std::vector<int,_std::allocator<int>_>::operator[](local_120,local_190);
        local_188 = *pvVar15 + local_188;
      }
      local_c4 = local_c4 + 1;
      Imf_3_4::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffda4,uVar18));
    }
    if (in_stack_00000008 == (vector<int,_std::allocator<int>_> *)0x0) {
      std::chrono::_V2::steady_clock::now();
      in_stack_fffffffffffffdc0 = local_30;
      iVar4 = Imf_3_4::DeepTiledInputPart::numXTiles((int)local_30);
      iVar5 = Imf_3_4::DeepTiledInputPart::numYTiles((int)local_30);
      uVar17 = 0;
      Imf_3_4::DeepTiledInputPart::readTiles
                ((int)in_stack_fffffffffffffdc0,0,iVar4 + -1,0,iVar5 + -1,0);
      std::chrono::_V2::steady_clock::now();
      start_00.__d.__r._4_4_ = in_stack_fffffffffffffdb4;
      start_00.__d.__r._0_4_ = in_stack_fffffffffffffdb0;
      end_00.__d.__r._4_4_ = in_stack_fffffffffffffdac;
      end_00.__d.__r._0_4_ = uVar19;
      timing(start_00,end_00);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffda4,uVar18),
                 (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffd9c,uVar17));
    }
    partSizeData::partSizeData((partSizeData *)in_stack_fffffffffffffdc0);
    in_RDI->rawSize = local_150 * local_c8 + local_78 * 4;
    in_RDI->pixelCount = local_78;
    in_RDI->isDeep = true;
    in_RDI->isTiled = true;
    in_RDI->channelCount = (long)local_7c;
    return in_RDI;
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"exrmetrics does not support ripmapped deep tiled parts")
  ;
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

partSizeData
initAndReadDeepTiled (
    vector<int>&           sampleCount,
    vector<vector<char>>&  sampleData,
    vector<vector<char*>>& pixelPtrs,
    DeepFrameBuffer&       buf,
    DeepTiledInputPart&    in,
    const vector<int>*     inputSampleCount,
    const Header&          outHeader,
    vector<double>&        countPerf,
    vector<double>&        samplePerf)
{

    TileDescription tiling = in.header ().tileDescription ();

    if (tiling.mode == MIPMAP_LEVELS)
    {
        throw runtime_error (
            "exrmetrics does not support mipmapped deep tiled parts");
    }

    if (tiling.mode == RIPMAP_LEVELS)
    {
        throw runtime_error (
            "exrmetrics does not support ripmapped deep tiled parts");
    }

    Box2i    dw        = in.header ().dataWindow ();
    uint64_t width     = dw.max.x + 1 - dw.min.x;
    uint64_t height    = dw.max.y + 1 - dw.min.y;
    uint64_t numPixels = width * height;
    int      numChans  = channelCount (in.header ());

    uint64_t offsetToOrigin = width * static_cast<uint64_t> (dw.min.y) +
                              static_cast<uint64_t> (dw.min.x);

    pixelPtrs.resize (numChans);
    sampleCount.resize (numPixels);

    buf.insertSampleCountSlice (Slice (
        UINT,
        (char*) (sampleCount.data () - offsetToOrigin),
        sizeof (int),
        sizeof (int) * width));
    int channelNumber  = 0;
    int bytesPerSample = 0;

    for (ChannelList::ConstIterator i = outHeader.channels ().begin ();
         i != outHeader.channels ().end ();
         ++i)
    {
        pixelPtrs[channelNumber].resize (numPixels);
        int samplesize = pixelTypeSize (i.channel ().type);
        buf.insert (
            i.name (),
            DeepSlice (
                i.channel ().type,
                (char*) (pixelPtrs[channelNumber].data () - offsetToOrigin),
                sizeof (char*),
                sizeof (char*) * width,
                samplesize));
        ++channelNumber;
        bytesPerSample += samplesize;
    }

    const vector<int>& samples = inputSampleCount ? *inputSampleCount
                                                  : sampleCount;

    if (!inputSampleCount)
    {
        in.setFrameBuffer (buf);

        steady_clock::time_point startCountRead = steady_clock::now ();

        in.readPixelSampleCounts (
            0, in.numXTiles (0) - 1, 0, in.numYTiles (0) - 1, 0, 0);
        steady_clock::time_point endCountRead = steady_clock::now ();

        countPerf.push_back (timing (startCountRead, endCountRead));
    }
    size_t totalSamples = 0;

    for (int i: samples)
    {
        totalSamples += i;
    }

    sampleData.resize (numChans);
    channelNumber = 0;

    for (ChannelList::ConstIterator i = in.header ().channels ().begin ();
         i != in.header ().channels ().end ();
         ++i)
    {
        int samplesize = pixelTypeSize (i.channel ().type);
        sampleData[channelNumber].resize (samplesize * totalSamples);
        int offset = 0;
        for (uint64_t p = 0; p < numPixels; ++p)
        {
            pixelPtrs[channelNumber][p] =
                sampleData[channelNumber].data () + offset * samplesize;
            offset += samples[p];
        }

        ++channelNumber;
    }

    if (!inputSampleCount)
    {
        steady_clock::time_point startSampleRead = steady_clock::now ();
        in.readTiles (0, in.numXTiles (0) - 1, 0, in.numYTiles (0) - 1, 0, 0);
        steady_clock::time_point endSampleRead = steady_clock::now ();

        samplePerf.push_back (timing (startSampleRead, endSampleRead));
    }

    partSizeData data;
    data.rawSize    = totalSamples * bytesPerSample + numPixels * sizeof (int);
    data.pixelCount = numPixels;
    data.isDeep     = true;
    data.isTiled    = true;
    data.channelCount = numChans;
    return data;
}